

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O2

void __thiscall Heap::sort_down(Heap *this,GridNode *item)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  
  while( true ) {
    uVar3 = (long)item->index * 2 + 1;
    if (this->count <= (int)(uint)uVar3) {
      return;
    }
    uVar2 = item->index * 2 + 2;
    if ((int)uVar2 < this->count) {
      iVar1 = GridNode::compare_item(this->list[uVar3],this->list[(int)uVar2]);
      if (-1 < iVar1) {
        uVar2 = (uint)uVar3;
      }
      uVar3 = (ulong)uVar2;
    }
    iVar1 = GridNode::compare_item(item,this->list[(int)uVar3]);
    if (-1 < iVar1) break;
    swap_items(this,this->list[(int)uVar3],item);
  }
  return;
}

Assistant:

void sort_down(GridNode *item)
    {
        while (true)
        {
            int childIndex1 = item->index * 2 + 1;
            int childIndex2 = item->index * 2 + 2;
            int newIndex = 0;
            if (childIndex1 < count)
            {
                newIndex = childIndex1;
                if (childIndex2 < count)
                {
                    if (list[childIndex1]->compare_item(list[childIndex2]) < 0)
                    {
                        newIndex = childIndex2;
                    }
                }
                if (item->compare_item(list[newIndex]) < 0)
                {
                    swap_items(list[newIndex], item);
                }
                else
                {
                    return;
                }
            }
            else
            {
                return;
            }
        }
    }